

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_attributeValueTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  uint local_4c;
  uint local_3c;
  char *start;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  end_local = ptr;
  if (ptr == end) {
    enc_local._4_4_ = -4;
  }
  else {
    while (end_local != end) {
      if (*end_local == '\0') {
        local_3c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
      }
      else {
        local_3c = unicode_byte_type(*end_local,end_local[1]);
      }
      switch(local_3c) {
      case 2:
        *nextTokPtr = end_local;
        return 0;
      case 3:
        if (end_local == ptr) {
          iVar1 = big2_scanRef(enc,end_local + 2,end,nextTokPtr);
          return iVar1;
        }
        *nextTokPtr = end_local;
        return 6;
      default:
        end_local = end_local + 2;
        break;
      case 5:
        end_local = end_local + 2;
        break;
      case 6:
        end_local = end_local + 3;
        break;
      case 7:
        end_local = end_local + 4;
        break;
      case 9:
        if (end_local != ptr) {
          *nextTokPtr = end_local;
          return 6;
        }
        pcVar2 = end_local + 2;
        if (pcVar2 == end) {
          return -3;
        }
        if (*pcVar2 == '\0') {
          local_4c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[3]);
        }
        else {
          local_4c = unicode_byte_type(*pcVar2,end_local[3]);
        }
        if (local_4c == 10) {
          pcVar2 = end_local + 4;
        }
        end_local = pcVar2;
        *nextTokPtr = end_local;
        return 7;
      case 10:
        if (end_local == ptr) {
          *nextTokPtr = end_local + 2;
          return 7;
        }
        *nextTokPtr = end_local;
        return 6;
      case 0x15:
        if (end_local == ptr) {
          *nextTokPtr = end_local + 2;
          return 0x27;
        }
        *nextTokPtr = end_local;
        return 6;
      }
    }
    *nextTokPtr = end_local;
    enc_local._4_4_ = 6;
  }
  return enc_local._4_4_;
}

Assistant:

static
int PREFIX(attributeValueTok)(const ENCODING *enc, const char *ptr, const char *end,
                              const char **nextTokPtr)
{
  const char *start;
  if (ptr == end)
    return XML_TOK_NONE;
  start = ptr;
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: ptr += n; break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_AMP:
      if (ptr == start)
        return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_LT:
      /* this is for inside entity references */
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    case BT_LF:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_CR:
      if (ptr == start) {
        ptr += MINBPC(enc);
        if (ptr == end)
          return XML_TOK_TRAILING_CR;
        if (BYTE_TYPE(enc, ptr) == BT_LF)
          ptr += MINBPC(enc);
        *nextTokPtr = ptr;
        return XML_TOK_DATA_NEWLINE;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    case BT_S:
      if (ptr == start) {
        *nextTokPtr = ptr + MINBPC(enc);
        return XML_TOK_ATTRIBUTE_VALUE_S;
      }
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}